

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O2

Orphan<capnproto_test::capnp::test::TestInterface> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnproto_test::capnp::test::TestInterface>
          (Orphan<capnproto_test::capnp::test::TestInterface> *__return_storage_ptr__,
          Orphan<capnp::DynamicValue> *this)

{
  undefined1 local_70 [24];
  Builder local_58;
  
  get(&local_58,this);
  DynamicValue::Builder::AsImpl<capnproto_test::capnp::test::TestInterface,_(capnp::Kind)5>::apply
            ((Client *)local_70,&local_58);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_70 + 8));
  DynamicValue::Builder::~Builder(&local_58);
  this->type = UNKNOWN;
  capnp::_::OrphanBuilder::OrphanBuilder(&__return_storage_ptr__->builder,&this->builder);
  return __return_storage_ptr__;
}

Assistant:

Orphan<T> Orphan<DynamicValue>::releaseAs() {
  get().as<T>();  // type check
  type = DynamicValue::UNKNOWN;
  return Orphan<T>(kj::mv(builder));
}